

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::StackInterpreter::interpretPushThisContext(StackInterpreter *this)

{
  size_t sVar1;
  undefined8 uVar2;
  uint8_t *puVar3;
  StackMemory *pSVar4;
  
  pSVar4 = this->stack;
  sVar1 = this->pc;
  this->pc = sVar1 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar1);
  puVar3 = (pSVar4->stackFrame).framePointer;
  if (puVar3[-0xe] == '\0') {
    StackFrame::marryFrame(&pSVar4->stackFrame,pSVar4->context);
    pSVar4 = this->stack;
    puVar3 = (pSVar4->stackFrame).framePointer;
  }
  uVar2 = *(undefined8 *)(puVar3 + -0x18);
  puVar3 = (pSVar4->stackFrame).stackPointer;
  (pSVar4->stackFrame).stackPointer = puVar3 + -8;
  *(undefined8 *)(puVar3 + -8) = uVar2;
  return;
}

Assistant:

void interpretPushThisContext()
	{
        fetchNextInstructionOpcode();

        // Ensure my frame is married.
        stack->ensureFrameIsMarried();

        pushOop(stack->getThisContext());
	}